

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

bool cmsys::SystemTools::StringEndsWith(string *str1,char *str2)

{
  int iVar1;
  ulong uVar2;
  size_t __n;
  long lVar3;
  size_t len2;
  size_t len1;
  char *str2_local;
  string *str1_local;
  
  if (str2 == (char *)0x0) {
    str1_local._7_1_ = false;
  }
  else {
    uVar2 = std::__cxx11::string::size();
    __n = strlen(str2);
    str1_local._7_1_ = false;
    if (__n <= uVar2) {
      lVar3 = std::__cxx11::string::c_str();
      iVar1 = strncmp((char *)(lVar3 + (uVar2 - __n)),str2,__n);
      str1_local._7_1_ = iVar1 == 0;
    }
  }
  return str1_local._7_1_;
}

Assistant:

bool SystemTools::StringEndsWith(const std::string& str1, const char* str2)
{
  if (!str2) {
    return false;
  }
  size_t len1 = str1.size(), len2 = strlen(str2);
  return len1 >= len2 && !strncmp(str1.c_str() + (len1 - len2), str2, len2)
    ? true
    : false;
}